

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::init(Texture3DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  RenderTarget *this_00;
  NotSupportedError *this_01;
  Texture3D *this_02;
  RenderContext *context;
  Texture3D *pTVar2;
  PixelBufferAccess *access;
  RGBA local_fc;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vec4 local_d8;
  uint local_c8;
  uint local_c4;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  allocator<char> local_99;
  string local_98;
  int local_74;
  float *pfStack_70;
  int numLevels;
  Vec4 *cBias;
  Vec4 *cScale;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  Texture3DMipmapCase *this_local;
  
  fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&cScale,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  cBias = (Vec4 *)(fmtInfo.valueMax.m_data + 2);
  pfStack_70 = fmtInfo.lookupScale.m_data + 2;
  iVar1 = de::max<int>(this->m_width,this->m_height);
  iVar1 = de::max<int>(iVar1,this->m_depth);
  local_74 = deLog2Floor32(iVar1);
  local_74 = local_74 + 1;
  if (this->m_coordType == COORDTYPE_PROJECTED) {
    this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = tcu::RenderTarget::getNumSamples(this_00);
    if (0 < iVar1) {
      step._3_1_ = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 "Projected lookup validation not supported in multisample config",&local_99);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_98);
      step._3_1_ = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_02 = (Texture3D *)operator_new(0x70);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture3D::Texture3D
            (this_02,context,this->m_internalFormat,this->m_width,this->m_height,this->m_depth);
  this->m_texture = this_02;
  for (inc = 0; (int)inc < local_74; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(local_74 + -1));
    rgb = ::deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_c4 = color * 0x100 | 0xff0000 | rgb;
    local_c8 = local_c4 | 0xff000000;
    pTVar2 = glu::Texture3D::getRefTexture(this->m_texture);
    tcu::Texture3D::allocLevel(pTVar2,inc);
    pTVar2 = glu::Texture3D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar2->super_TextureLevelPyramid,inc);
    tcu::RGBA::RGBA(&local_fc,local_c8);
    tcu::RGBA::toVec((RGBA *)&local_f8);
    tcu::operator*((tcu *)&local_e8,&local_f8,cBias);
    tcu::operator+((tcu *)&local_d8,&local_e8,(Vector<float,_4> *)pfStack_70);
    tcu::clear(access,&local_d8);
  }
  glu::Texture3D::upload(this->m_texture);
  return extraout_EAX;
}

Assistant:

void Texture3DMipmapCase::init (void)
{
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(m_internalFormat);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth))+1;

	if (m_coordType == COORDTYPE_PROJECTED && m_context.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (0xff << 16) | (dec << 8) | inc;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}